

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

__m256i * paeth_pred(__m256i *left,__m256i *top,__m256i *topleft)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 (*in_RDX) [32];
  __m256i *in_RSI;
  undefined1 (*in_RDI) [32];
  __m256i mask2;
  __m256i mask1;
  __m256i ptl;
  __m256i pt;
  __m256i pl;
  __m256i base;
  
  auVar1 = vpaddw_avx2((undefined1  [32])*in_RSI,*in_RDI);
  auVar4 = vpsubw_avx2(auVar1,*in_RDX);
  auVar1 = vpsubw_avx2(auVar4,*in_RDI);
  auVar1 = vpabsw_avx2(auVar1);
  auVar5 = vpsubw_avx2(auVar4,(undefined1  [32])*in_RSI);
  auVar5 = vpabsw_avx2(auVar5);
  auVar4 = vpsubw_avx2(auVar4,*in_RDX);
  auVar4 = vpabsw_avx2(auVar4);
  auVar2 = vpcmpgtw_avx2(auVar1,auVar5);
  auVar1 = vpcmpgtw_avx2(auVar1,auVar4);
  auVar3 = vpor_avx2(auVar2,auVar1);
  auVar2 = vpcmpgtw_avx2(auVar5,auVar4);
  auVar5 = vpcmpeqd_avx2(auVar3,auVar3);
  auVar4 = vpandn_avx2(auVar3,*in_RDI);
  auVar1 = vpand_avx2(auVar2,*in_RDX);
  auVar5 = vpand_avx2(auVar2 ^ auVar5,(undefined1  [32])*in_RSI);
  auVar1 = vpor_avx2(auVar5,auVar1);
  auVar1 = vpand_avx2(auVar3,auVar1);
  vpor_avx2(auVar1,auVar4);
  return in_RSI;
}

Assistant:

static inline __m256i paeth_pred(const __m256i *left, const __m256i *top,
                                 const __m256i *topleft) {
  const __m256i base =
      _mm256_sub_epi16(_mm256_add_epi16(*top, *left), *topleft);

  __m256i pl = _mm256_abs_epi16(_mm256_sub_epi16(base, *left));
  __m256i pt = _mm256_abs_epi16(_mm256_sub_epi16(base, *top));
  __m256i ptl = _mm256_abs_epi16(_mm256_sub_epi16(base, *topleft));

  __m256i mask1 = _mm256_cmpgt_epi16(pl, pt);
  mask1 = _mm256_or_si256(mask1, _mm256_cmpgt_epi16(pl, ptl));
  __m256i mask2 = _mm256_cmpgt_epi16(pt, ptl);

  pl = _mm256_andnot_si256(mask1, *left);

  ptl = _mm256_and_si256(mask2, *topleft);
  pt = _mm256_andnot_si256(mask2, *top);
  pt = _mm256_or_si256(pt, ptl);
  pt = _mm256_and_si256(mask1, pt);

  return _mm256_or_si256(pt, pl);
}